

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageFuelReload.cpp
# Opt level: O2

void __thiscall DIS::StorageFuelReload::unmarshal(StorageFuelReload *this,DataStream *dataStream)

{
  DataStream::operator>>(dataStream,&this->_standardQuantity);
  DataStream::operator>>(dataStream,&this->_maximumQuantity);
  DataStream::operator>>(dataStream,&this->_standardQuantityReloadTime);
  DataStream::operator>>(dataStream,&this->_maximumQuantityReloadTime);
  DataStream::operator>>(dataStream,&this->_fuelMeasurementUnits);
  DataStream::operator>>(dataStream,&this->_fuelType);
  DataStream::operator>>(dataStream,&this->_fuelLocation);
  DataStream::operator>>(dataStream,&this->_padding);
  return;
}

Assistant:

void StorageFuelReload::unmarshal(DataStream& dataStream)
{
    dataStream >> _standardQuantity;
    dataStream >> _maximumQuantity;
    dataStream >> _standardQuantityReloadTime;
    dataStream >> _maximumQuantityReloadTime;
    dataStream >> _fuelMeasurementUnits;
    dataStream >> _fuelType;
    dataStream >> _fuelLocation;
    dataStream >> _padding;
}